

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

void __thiscall line_hash_16::test_method(line_hash_16 *this)

{
  unit_test_log_t *puVar1;
  const_string local_e8;
  const_string local_d8;
  const_string local_c8;
  const_string local_b8;
  const_string local_a8;
  const_string local_98;
  char *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  unit_test_log_t local_58;
  undefined1 local_50;
  undefined1 *local_48;
  char *local_40;
  undefined4 local_38;
  unsigned_short local_32;
  
  local_e8.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_e8.m_end = "";
  local_d8.m_begin = "";
  local_d8.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,&local_e8,0x46,&local_d8);
  local_50 = 0;
  local_58.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_001cf9a0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = "";
  local_88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_80 = "";
  local_32 = assert_hash::line_hash<unsigned_short>(0);
  local_38 = 0;
  puVar1 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_short,int>
            (puVar1,&local_88,0x46,1,2,&local_32,"ah::line_hash< std::uint16_t >( 0 )",&local_38,"0"
            );
  local_c8.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_c8.m_end = "";
  local_b8.m_begin = "";
  local_b8.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_c8,0x47,&local_b8);
  local_50 = 0;
  local_58.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_001cf9a0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = "";
  local_78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_70 = "";
  local_32 = assert_hash::line_hash<unsigned_short>(0x12);
  local_38 = 0x12;
  puVar1 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_short,int>
            (puVar1,&local_78,0x47,1,2,&local_32,"ah::line_hash< std::uint16_t >( 0x12 )",&local_38,
             "0x12");
  local_a8.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_a8.m_end = "";
  local_98.m_begin = "";
  local_98.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_a8,0x48,&local_98);
  local_50 = 0;
  local_58.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_001cf9a0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = "";
  local_68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_60 = "";
  local_32 = assert_hash::line_hash<unsigned_short>(0x12345678);
  local_38 = 0x68ac;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_short,int>
            (&local_58,&local_68,0x48,1,2,&local_32,"ah::line_hash< std::uint16_t >( 0x12345678 )",
             &local_38,"( 0x5678 + 0x1234 ) & 0xffff");
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( line_hash_16 )
{
    BOOST_CHECK_EQUAL( ah::line_hash< std::uint16_t >( 0 ), 0 );
    BOOST_CHECK_EQUAL( ah::line_hash< std::uint16_t >( 0x12 ), 0x12 );
    BOOST_CHECK_EQUAL( ah::line_hash< std::uint16_t >( 0x12345678 ), ( 0x5678 + 0x1234 ) & 0xffff );
}